

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

QImage * __thiscall
QFontEngine::alphaRGBMapForGlyph(QFontEngine *this,glyph_t glyph,QFixedPoint *param_3,QTransform *t)

{
  int iVar1;
  uint r;
  QRgb QVar2;
  uchar *puVar3;
  uchar *puVar4;
  undefined4 in_EDX;
  long *in_RSI;
  QImage *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  int val;
  int x;
  uchar *src;
  uint *dst;
  int y;
  QImage *rgbMask;
  QImage alphaMask;
  QImage *this_00;
  undefined4 in_stack_ffffffffffffff90;
  int local_64;
  int local_50;
  undefined1 local_20 [16];
  QImageData *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  (**(code **)(*in_RSI + 0x98))(local_20,in_RSI,in_EDX,in_R8);
  (this_00->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this_00->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
  this_00->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  iVar1 = QImage::width((QImage *)local_20);
  QImage::height((QImage *)local_20);
  QImage::QImage((QImage *)CONCAT44(iVar1,in_stack_ffffffffffffff90),(int)((ulong)this_00 >> 0x20),
                 (int)this_00,(Format)((ulong)in_RDI >> 0x20));
  for (local_50 = 0; iVar1 = QImage::height((QImage *)local_20), local_50 < iVar1;
      local_50 = local_50 + 1) {
    puVar3 = QImage::scanLine(this_00,(int)((ulong)in_RDI >> 0x20));
    puVar4 = QImage::constScanLine((QImage *)local_20,local_50);
    for (local_64 = 0; iVar1 = QImage::width((QImage *)local_20), local_64 < iVar1;
        local_64 = local_64 + 1) {
      r = (uint)puVar4[local_64];
      QVar2 = qRgb(r,r,r);
      *(QRgb *)(puVar3 + (long)local_64 * 4) = QVar2;
    }
  }
  QImage::~QImage(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QImage QFontEngine::alphaRGBMapForGlyph(glyph_t glyph, const QFixedPoint &/*subPixelPosition*/, const QTransform &t)
{
    const QImage alphaMask = alphaMapForGlyph(glyph, t);
    QImage rgbMask(alphaMask.width(), alphaMask.height(), QImage::Format_RGB32);

    for (int y=0; y<alphaMask.height(); ++y) {
        uint *dst = (uint *) rgbMask.scanLine(y);
        const uchar *src = alphaMask.constScanLine(y);
        for (int x=0; x<alphaMask.width(); ++x) {
            int val = src[x];
            dst[x] = qRgb(val, val, val);
        }
    }

    return rgbMask;
}